

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.hpp
# Opt level: O0

KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>
supermap::io::
DeserializeHelper<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>::
deserialize(istream *is)

{
  ByteArray<4UL> extraout_RDX;
  istream *in_RDI;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> KVar1;
  istream *value_;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *this;
  array<unsigned_char,_2UL> in_stack_ffffffffffffffd6;
  undefined1 local_20 [32];
  
  value_ = in_RDI;
  local_20._14_2_ = deserialize<supermap::Key<2ul>,void>(in_RDI);
  this = (KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *)local_20;
  deserialize<supermap::ByteArray<4ul>,void>(in_RDI);
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>::KeyValue
            (this,(Key<2UL>)in_stack_ffffffffffffffd6._M_elems,(ByteArray<4UL> *)value_);
  ByteArray<4UL>::~ByteArray((ByteArray<4UL> *)0x15d90d);
  KVar1.value.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       extraout_RDX.data_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  KVar1._0_8_ = in_RDI;
  return KVar1;
}

Assistant:

static KeyValue<Key, Value> deserialize(std::istream &is) {
        return KeyValue<Key, Value>
            {
                io::deserialize<Key>(is),
                io::deserialize<Value>(is)
            };
    }